

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginFverb.cpp
# Opt level: O1

void __thiscall
PluginFverb::runSegmented(PluginFverb *this,float **inputs,float **outputs,uint32_t frames)

{
  float *pfVar1;
  pointer __dest;
  uint32_t frames_00;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  vector<float,_std::allocator<float>_> *pvVar6;
  uint __n2;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float *offsetOutputs [2];
  float *offsetInputs [2];
  float *inputKeep [2];
  float *local_68 [4];
  long alStack_48 [3];
  
  pvVar6 = this->fInputKeep;
  uVar2 = (ulong)frames;
  lVar4 = 0;
  do {
    __dest = (pvVar6->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    alStack_48[lVar4] = (long)__dest;
    if (frames != 0) {
      memmove(__dest,inputs[lVar4],uVar2 * 4);
    }
    lVar4 = lVar4 + 1;
    pvVar6 = pvVar6 + 1;
  } while (lVar4 == 1);
  if (frames != 0) {
    uVar5 = 0;
    do {
      lVar4 = 0;
      do {
        local_68[lVar4 + 2] = inputs[lVar4] + uVar5;
        lVar4 = lVar4 + 1;
      } while (lVar4 == 1);
      lVar4 = 0;
      do {
        local_68[lVar4] = outputs[lVar4] + uVar5;
        lVar4 = lVar4 + 1;
      } while (lVar4 == 1);
      frames_00 = frames - uVar5;
      if (0xff < frames - uVar5) {
        frames_00 = 0x100;
      }
      if (this->fVintage == false) {
        runAtNormalRate(this,local_68 + 2,local_68,frames_00);
      }
      else {
        runDownsampled(this,local_68 + 2,local_68,frames_00);
      }
      uVar5 = frames_00 + uVar5;
    } while (uVar5 < frames);
  }
  fVar7 = (this->fWet).mem;
  pfVar1 = &(this->fWet).target;
  if ((fVar7 != *pfVar1) || (NAN(fVar7) || NAN(*pfVar1))) {
    if (frames != 0) {
      uVar3 = 0;
      do {
        fVar7 = (this->fWet).mem;
        fVar8 = (this->fWet).target - fVar7;
        fVar9 = ABS(fVar8);
        fVar10 = ABS((this->fWet).step);
        fVar11 = fVar10;
        if (fVar9 <= fVar10) {
          fVar11 = fVar9;
        }
        fVar7 = (float)(~-(uint)NAN(fVar9) & (uint)fVar11 | -(uint)NAN(fVar9) & (uint)fVar10 |
                       (uint)fVar8 & 0x80000000) + fVar7;
        (this->fWet).mem = fVar7;
        lVar4 = 0;
        do {
          outputs[lVar4][uVar3] = outputs[lVar4][uVar3] * fVar7;
          lVar4 = lVar4 + 1;
        } while (lVar4 == 1);
        uVar3 = uVar3 + 1;
      } while (uVar3 != uVar2);
    }
  }
  else if (frames != 0) {
    uVar3 = 0;
    do {
      lVar4 = 0;
      do {
        outputs[lVar4][uVar3] = outputs[lVar4][uVar3] * fVar7;
        lVar4 = lVar4 + 1;
      } while (lVar4 == 1);
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar2);
  }
  fVar7 = (this->fDry).mem;
  pfVar1 = &(this->fDry).target;
  if ((fVar7 != *pfVar1) || (NAN(fVar7) || NAN(*pfVar1))) {
    if (frames != 0) {
      uVar3 = 0;
      do {
        fVar7 = (this->fDry).mem;
        fVar8 = (this->fDry).target - fVar7;
        fVar9 = ABS(fVar8);
        fVar10 = ABS((this->fDry).step);
        fVar11 = fVar10;
        if (fVar9 <= fVar10) {
          fVar11 = fVar9;
        }
        fVar7 = (float)(~-(uint)NAN(fVar9) & (uint)fVar11 | -(uint)NAN(fVar9) & (uint)fVar10 |
                       (uint)fVar8 & 0x80000000) + fVar7;
        (this->fDry).mem = fVar7;
        lVar4 = 0;
        do {
          outputs[lVar4][uVar3] =
               *(float *)(alStack_48[lVar4] + uVar3 * 4) * fVar7 + outputs[lVar4][uVar3];
          lVar4 = lVar4 + 1;
        } while (lVar4 == 1);
        uVar3 = uVar3 + 1;
      } while (uVar3 != uVar2);
    }
  }
  else if (frames != 0) {
    uVar3 = 0;
    do {
      lVar4 = 0;
      do {
        outputs[lVar4][uVar3] =
             *(float *)(alStack_48[lVar4] + uVar3 * 4) * fVar7 + outputs[lVar4][uVar3];
        lVar4 = lVar4 + 1;
      } while (lVar4 == 1);
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar2);
  }
  return;
}

Assistant:

void PluginFverb::runSegmented(const float **inputs, float **outputs, uint32_t frames)
{
    float *inputKeep[kNumChannels];
    for (uint32_t ch = 0; ch < kNumChannels; ++ch) {
        inputKeep[ch] = fInputKeep[ch].data();
        std::copy_n(inputs[ch], frames, inputKeep[ch]);
    }

    uint32_t index = 0;
    while (index < frames) {
        uint32_t bs = frames - index;
        if (bs > kMaxResampledBlock)
            bs = kMaxResampledBlock;

        const float *offsetInputs[kNumChannels];
        float *offsetOutputs[kNumChannels];
        for (uint32_t ch = 0; ch < kNumChannels; ++ch)
            offsetInputs[ch] = inputs[ch] + index;
        for (uint32_t ch = 0; ch < kNumChannels; ++ch)
            offsetOutputs[ch] = outputs[ch] + index;

        if (!fVintage)
            runAtNormalRate(offsetInputs, offsetOutputs, bs);
        else
            runDownsampled(offsetInputs, offsetOutputs, bs);

        index += bs;
    }

    ///
    if (fWet.getCurrentValue() == fWet.getTarget()) {
        float wet = fWet.getCurrentValue();
        for (uint32_t i = 0; i < frames; ++i) {
            for (uint32_t ch = 0; ch < kNumChannels; ++ch)
                outputs[ch][i] *= wet;
        }
    }
    else {
        for (uint32_t i = 0; i < frames; ++i) {
            float wet = fWet.next();
            for (uint32_t ch = 0; ch < kNumChannels; ++ch)
                outputs[ch][i] *= wet;
        }
    }

    ///
    if (fDry.getCurrentValue() == fDry.getTarget()) {
        float dry = fDry.getCurrentValue();
        for (uint32_t i = 0; i < frames; ++i) {
            for (uint32_t ch = 0; ch < kNumChannels; ++ch)
                outputs[ch][i] += dry * inputKeep[ch][i];
        }
    }
    else {
        for (uint32_t i = 0; i < frames; ++i) {
            float dry = fDry.next();
            for (uint32_t ch = 0; ch < kNumChannels; ++ch)
                outputs[ch][i] += dry * inputKeep[ch][i];
        }
    }
}